

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_OverrideChain_Test::TestBody(SSLTest_OverrideChain_Test *this)

{
  UniquePtr<struct_stack_st_X509> UVar1;
  int iVar2;
  SSL_METHOD *meth;
  stack_st_X509 *chain_00;
  char *in_R9;
  char *expected_predicate_value;
  initializer_list<x509_st_*> __l;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  tuple<x509_st_*,_bssl::internal::Deleter> local_e8;
  UniquePtr<SSL> client;
  UniquePtr<SSL_CTX> ctx;
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_X509> wrong_chain;
  UniquePtr<X509> leaf;
  UniquePtr<X509> ca;
  AssertHelper local_a8;
  UniquePtr<struct_stack_st_X509> chain;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_38;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_30;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_28;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<SSL> server;
  
  GetChainTestKey();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)0x3597b2,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&leaf,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x137f,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&leaf,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf);
    std::__cxx11::string::~string((string *)local_98);
    if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00183ccd;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  GetChainTestCertificate();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)"leaf","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ca,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1381,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ca,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ca);
    std::__cxx11::string::~string((string *)local_98);
    if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    GetChainTestIntermediate();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         ca._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        ca._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)0x31ac4b,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&chain,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1383,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&chain,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&chain);
      std::__cxx11::string::~string((string *)local_98);
      if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
        (**(code **)(*(long *)local_f0._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
           (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
           OPENSSL_sk_new_null();
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
           chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
           (_Head_base<0UL,_stack_st_X509_*,_false>)0x0;
      if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
          chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
          (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)0x2fafd2,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&wrong_chain,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1386,(char *)local_98._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&wrong_chain,(Message *)&local_f0);
LAB_00183b30:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wrong_chain);
        std::__cxx11::string::~string((string *)local_98);
        if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar1._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
             chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
        UpRef((bssl *)&local_28,
              (X509 *)ca._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
        gtest_ar_.success_ =
             PushToStack<stack_st_X509>
                       ((stack_st_X509 *)
                        UVar1._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&local_28);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)&gtest_ar_,
                     (AssertionResult *)"bssl::PushToStack(chain.get(), bssl::UpRef(ca))","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&wrong_chain,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,4999,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&wrong_chain,(Message *)&local_f0);
          goto LAB_00183b30;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        wrong_chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
             (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
             OPENSSL_sk_new_null();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
             wrong_chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
             (_Head_base<0UL,_stack_st_X509_*,_false>)0x0;
        if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
            wrong_chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
            (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
          testing::Message::Message((Message *)&local_f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)"wrong_chain",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ctx,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x138a,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&local_f0);
LAB_00183c79:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
          std::__cxx11::string::~string((string *)local_98);
          if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
            (**(code **)(*(long *)local_f0._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          UVar1._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
               wrong_chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
          UpRef((bssl *)&local_30,
                (X509 *)leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
          gtest_ar_.success_ =
               PushToStack<stack_st_X509>
                         ((stack_st_X509 *)
                          UVar1._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&local_30);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&gtest_ar_,
                       (AssertionResult *)"bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf))",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x138b,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&local_f0);
            goto LAB_00183c79;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          UVar1 = wrong_chain;
          UpRef((bssl *)&local_38,
                (X509 *)leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
          gtest_ar_.success_ =
               PushToStack<stack_st_X509>
                         ((stack_st_X509 *)
                          UVar1._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&local_38);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&gtest_ar_,
                       (AssertionResult *)"bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf))",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x138c,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&local_f0);
            goto LAB_00183c79;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          meth = (SSL_METHOD *)TLS_method();
          ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
               ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
          if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
              ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false"
                       ,"true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x138f,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&client,(Message *)&local_f0)
            ;
LAB_00183ebd:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
            std::__cxx11::string::~string((string *)local_98);
            if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
              (**(code **)(*(long *)local_f0._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = SSL_CTX_use_certificate
                              ((SSL_CTX *)
                               ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (X509 *)leaf._M_t.
                                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&gtest_ar_,
                         (AssertionResult *)"SSL_CTX_use_certificate(ctx.get(), leaf.get())","false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1390,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client,(Message *)&local_f0);
              goto LAB_00183ebd;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = SSL_CTX_use_PrivateKey
                              ((SSL_CTX *)
                               ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (EVP_PKEY *)
                               key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&gtest_ar_,
                         (AssertionResult *)"SSL_CTX_use_PrivateKey(ctx.get(), key.get())","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1391,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client,(Message *)&local_f0);
              goto LAB_00183ebd;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = SSL_CTX_set1_chain((SSL_CTX *)
                                       ctx._M_t.
                                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                       (stack_st_X509 *)
                                       wrong_chain._M_t.
                                       super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&gtest_ar_,
                         (AssertionResult *)"SSL_CTX_set1_chain(ctx.get(), wrong_chain.get())",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1395,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client,(Message *)&local_f0);
              goto LAB_00183ebd;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar2 = SSL_CTX_set1_chain((SSL_CTX *)
                                       ctx._M_t.
                                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                       (stack_st_X509 *)
                                       chain._M_t.
                                       super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&gtest_ar_,
                         (AssertionResult *)"SSL_CTX_set1_chain(ctx.get(), chain.get())","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1396,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client,(Message *)&local_f0);
              goto LAB_00183ebd;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            local_98._16_8_ = &local_78;
            local_98._24_8_ = 0;
            local_78._8_8_ = 0;
            sStack_60 = 0;
            local_58._8_8_ = 0;
            local_98._0_8_ = (SSL_SESSION *)0x0;
            local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
            local_68._M_p = (pointer)&local_58;
            local_78._M_allocated_capacity = 0;
            local_58._M_allocated_capacity = 0;
            local_48._0_4_ = 0;
            local_48._4_1_ = false;
            local_48._5_3_ = 0;
            expected_predicate_value = (char *)0x1;
            gtest_ar_.success_ =
                 ConnectClientAndServer
                           (&client,&server,
                            (SSL_CTX *)
                            ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                            .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (SSL_CTX *)
                            ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                            .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)local_98,true);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            ClientConfig::~ClientConfig((ClientConfig *)local_98);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "ConnectClientAndServer(&client, &server, ctx.get(), ctx.get())","false",
                         "true",expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1399,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_f0);
LAB_00183f53:
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              std::__cxx11::string::~string((string *)local_98);
              if ((x509_st *)local_f0._M_head_impl != (x509_st *)0x0) {
                (**(code **)(*(long *)local_f0._M_head_impl + 8))();
              }
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              chain_00 = SSL_get_peer_full_cert_chain
                                   ((SSL *)client._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              local_f0._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              local_e8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   ca._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l._M_len = 2;
              __l._M_array = (iterator)&local_f0;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l,
                         (allocator_type *)&local_a8);
              gtest_ar_.success_ =
                   ChainsEqual(chain_00,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&local_f0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "ChainsEqual(SSL_get_peer_full_cert_chain(client.get()), {leaf.get(), ca.get()})"
                           ,"false","true",expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x139b,(char *)local_98._0_8_);
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_f0);
                goto LAB_00183f53;
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
          }
          std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
        }
        std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&wrong_chain);
      }
      std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&chain);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&ca);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf);
LAB_00183ccd:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(SSLTest, OverrideChain) {
  bssl::UniquePtr<EVP_PKEY> key = GetChainTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> leaf = GetChainTestCertificate();
  ASSERT_TRUE(leaf);
  bssl::UniquePtr<X509> ca = GetChainTestIntermediate();
  ASSERT_TRUE(ca);

  bssl::UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  ASSERT_TRUE(chain);
  ASSERT_TRUE(bssl::PushToStack(chain.get(), bssl::UpRef(ca)));

  bssl::UniquePtr<STACK_OF(X509)> wrong_chain(sk_X509_new_null());
  ASSERT_TRUE(wrong_chain);
  ASSERT_TRUE(bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf)));
  ASSERT_TRUE(bssl::PushToStack(wrong_chain.get(), bssl::UpRef(leaf)));

  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(SSL_CTX_use_certificate(ctx.get(), leaf.get()));
  ASSERT_TRUE(SSL_CTX_use_PrivateKey(ctx.get(), key.get()));

  // Configure one chain, then replace it with another. Note this API considers
  // the chain to exclude the leaf.
  ASSERT_TRUE(SSL_CTX_set1_chain(ctx.get(), wrong_chain.get()));
  ASSERT_TRUE(SSL_CTX_set1_chain(ctx.get(), chain.get()));

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, ctx.get(), ctx.get()));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client.get()),
                          {leaf.get(), ca.get()}));
}